

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::add_sub<false,true,unsigned_short>
               (unsigned_short source,unsigned_short *destination,Status *status)

{
  ushort uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  ulong uVar4;
  ushort uVar5;
  FlagT FVar6;
  bool bVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  
  uVar1 = *destination;
  uVar5 = uVar1 - source;
  FVar6 = (FlagT)(uVar1 < source);
  status->carry_flag = FVar6;
  if (status->extend_flag != 0) {
    bVar7 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    FVar6 = (FlagT)(bVar7 || uVar1 < source);
    status->carry_flag = FVar6;
  }
  status->extend_flag = FVar6;
  status->zero_result = status->zero_result | (ulong)uVar5;
  uVar4 = ((ulong)(uVar5 ^ uVar1) | 0x80000000) &
          ((ulong)((source ^ uVar1) & 0x8000) | (ulong)uVar5 << 0x10);
  uVar8 = (uint)uVar4;
  auVar2._4_2_ = (short)(uVar4 >> 0x10);
  auVar2._0_4_ = uVar8;
  auVar2._6_8_ = SUB148(ZEXT614(0) << 0x40,6);
  auVar3._4_10_ = auVar2._4_10_;
  auVar3._0_4_ = uVar8 & 0xffff;
  auVar9._0_8_ = auVar3._0_8_ & 0xffffffff;
  auVar9._8_4_ = auVar2._4_4_;
  auVar9._12_4_ = 0;
  status->overflow_flag = auVar9._0_8_;
  status->negative_flag = auVar9._8_8_;
  *destination = uVar5;
  return;
}

Assistant:

static void add_sub(IntT source, IntT &destination, Status &status) {
	static_assert(!std::numeric_limits<IntT>::is_signed);

	IntT result = is_add ?
		destination + source :
		destination - source;
	status.carry_flag = is_add ? result < destination : result > destination;

	// If this is an extend operation, there's a second opportunity to create carry,
	// which requires a second test.
	if(is_extend && status.extend_flag) {
		if constexpr (is_add) {
			++result;
			status.carry_flag |= result == 0;
		} else {
			status.carry_flag |= result == 0;
			--result;
		}
	}
	status.extend_flag = status.carry_flag;

	// Extend operations can reset the zero flag only; non-extend operations
	// can either set it or reset it. Which in the reverse-logic world of
	// zero_result means ORing or storing.
	if constexpr (is_extend) {
		status.zero_result |= Status::FlagT(result);
	} else {
		status.zero_result = Status::FlagT(result);
	}
	status.set_negative(result);
	status.overflow_flag = Numeric::overflow<is_add>(destination, source, result);
	destination = result;
}